

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_utils.h
# Opt level: O0

void xray_re::
     trim_container<std::vector<xray_re::xr_ini_file::ini_section*,std::allocator<xray_re::xr_ini_file::ini_section*>>>
               (vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
                *container)

{
  ini_section *this;
  bool bVar1;
  reference ppiVar2;
  vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  local_38;
  __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
  local_20;
  iterator end;
  iterator it;
  vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  *container_local;
  
  end = std::
        vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
        ::begin(container);
  local_20._M_current =
       (ini_section **)
       std::
       vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
       ::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_20);
    if (!bVar1) break;
    ppiVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
              ::operator*(&end);
    this = *ppiVar2;
    if (this != (ini_section *)0x0) {
      xr_ini_file::ini_section::~ini_section(this);
      operator_delete(this,0x38);
    }
    __gnu_cxx::
    __normal_iterator<xray_re::xr_ini_file::ini_section_**,_std::vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>_>
    ::operator++(&end);
  }
  memset(&local_38,0,0x18);
  std::
  vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ::vector(&local_38);
  std::
  vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ::swap(&local_38,container);
  std::
  vector<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ::~vector(&local_38);
  return;
}

Assistant:

void trim_container(T& container)
{
	for (typename T::iterator it = container.begin(), end = container.end(); it != end; ++it)
		delete *it;
	T().swap(container);
}